

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O2

void predict_or_learn<true>(LRQFAstate *lrq,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  vw *pvVar9;
  ulong uVar10;
  unsigned_long uVar11;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  features *pfVar16;
  weight *pwVar17;
  ostream *poVar18;
  char *pcVar19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  byte *pbVar20;
  int iVar21;
  uint32_t *puVar22;
  size_type sVar23;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  ulong uVar24;
  uint64_t *puVar25;
  byte *pbVar26;
  size_t *__s;
  byte *pbVar27;
  uint uVar28;
  v_array<unsigned_char> *__range1;
  size_t sVar29;
  features *this_01;
  bool bVar30;
  float fVar31;
  float local_2b4;
  float local_2b0;
  ulong local_278;
  char *new_feature;
  char *new_space;
  char *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0 [3];
  stringstream new_feature_buffer;
  ostream local_1a8;
  
  pvVar9 = lrq->all;
  __s = lrq->orig_size;
  memset(__s,0,0x800);
  pbVar20 = (ec->super_example_predict).indices._end;
  for (pbVar15 = (ec->super_example_predict).indices._begin; pbVar15 != pbVar20;
      pbVar15 = pbVar15 + 1) {
    bVar3 = *pbVar15;
    __s[bVar3] = (long)(ec->super_example_predict).feature_space[bVar3].values._end -
                 (long)(ec->super_example_predict).feature_space[bVar3].values._begin >> 2;
  }
  local_278 = ec->example_counter;
  fVar1 = (ec->l).simple.label;
  uVar5 = lrq->k;
  bVar30 = (pvVar9->weights).sparse != false;
  puVar25 = &(pvVar9->weights).dense_weights._weight_mask;
  if (bVar30) {
    puVar25 = &(pvVar9->weights).sparse_weights._weight_mask;
  }
  uVar10 = *puVar25;
  puVar22 = &(pvVar9->weights).dense_weights._stride_shift;
  if (bVar30) {
    puVar22 = &(pvVar9->weights).sparse_weights._stride_shift;
  }
  uVar6 = *puVar22;
  local_2b0 = 0.0;
  local_2b4 = 0.0;
  for (iVar21 = 0; iVar21 != 2 - (uint)(fVar1 == 3.4028235e+38); iVar21 = iVar21 + 1) {
    pbVar15 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    sVar23 = (lrq->field_name)._M_string_length;
    pbVar20 = pbVar15;
    while (pbVar26 = pbVar20, pbVar26 != pbVar15 + sVar23) {
      for (pbVar27 = pbVar26 + 1; pbVar20 = pbVar26 + 1, pbVar27 != pbVar15 + sVar23;
          pbVar27 = pbVar27 + 1) {
        pbVar20 = pbVar27;
        pbVar15 = pbVar26;
        if ((local_278 & 1) == 0) {
          pbVar20 = pbVar26;
          pbVar15 = pbVar27;
        }
        bVar3 = *pbVar15;
        bVar4 = *pbVar20;
        pfVar16 = (ec->super_example_predict).feature_space + bVar3;
        iVar7 = lrq->field_id[bVar4];
        this_01 = (ec->super_example_predict).feature_space + bVar4;
        iVar8 = lrq->field_id[bVar3];
        this_00 = &(ec->super_example_predict).feature_space[bVar4].space_names;
        for (uVar14 = 0; uVar24 = (ulong)uVar14, uVar24 < __s[bVar3]; uVar14 = uVar14 + 1) {
          fVar2 = (pfVar16->values)._begin[uVar24];
          uVar11 = (pfVar16->indicies)._begin[uVar24];
          for (uVar13 = 1; uVar13 <= uVar5; uVar13 = uVar13 + 1) {
            uVar24 = ((ulong)(uVar13 + iVar7 * uVar5) << ((byte)uVar6 & 0x3f)) + uVar11;
            pwVar17 = parameters::operator[](&pvVar9->weights,uVar24 & uVar10);
            fVar31 = (ec->l).simple.label;
            if ((((fVar31 != 3.4028235e+38) || (NAN(fVar31))) && (*pwVar17 == 0.0)) &&
               (!NAN(*pwVar17))) {
              fVar31 = cheesyrand(uVar24);
              *pwVar17 = (fVar31 * 0.5) / SQRT((float)uVar5);
            }
            uVar28 = 0;
            while( true ) {
              uVar24 = (ulong)uVar28;
              if (__s[bVar4] <= uVar24) break;
              features::push_back(this_01,*pwVar17 * fVar2 * (this_01->values)._begin[uVar24],
                                  (this_01->indicies)._begin[uVar24] +
                                  ((ulong)(iVar8 * uVar5 + uVar13) << ((byte)uVar6 & 0x3f)));
              if ((pvVar9->audit != false) || (pvVar9->hash_inv == true)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&new_feature_buffer);
                poVar18 = std::operator<<(&local_1a8,bVar4);
                poVar18 = std::operator<<(poVar18,'^');
                poVar18 = std::operator<<(poVar18,(string *)
                                                  &(this_00->_begin[uVar24].
                                                                                                        
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->second);
                poVar18 = std::operator<<(poVar18,'^');
                std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
                new_space = strdup("lrqfa");
                std::__cxx11::stringbuf::str();
                pcVar19 = strdup(local_1d8);
                std::__cxx11::string::~string((string *)&local_1d8);
                new_feature = pcVar19;
                this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)operator_new(0x40);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<char_*&,_char_*&,_true>(this,&new_space,&new_feature);
                std::
                __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                          ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                            *)&local_1d8,this);
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(this_00,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_1d8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1d0);
                std::__cxx11::stringstream::~stringstream((stringstream *)&new_feature_buffer);
              }
              uVar28 = uVar28 + 1;
            }
          }
        }
        pbVar15 = (byte *)(lrq->field_name)._M_dataplus._M_p;
        sVar23 = (lrq->field_name)._M_string_length;
      }
    }
    LEARNER::learner<char,_example>::learn(base,ec,0);
    if (iVar21 == 0) {
      local_2b4 = (ec->pred).scalar;
      local_2b0 = ec->loss;
    }
    else {
      (ec->pred).scalar = local_2b4;
      ec->loss = local_2b0;
    }
    pbVar15 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    pbVar20 = pbVar15 + (lrq->field_name)._M_string_length;
    for (; pbVar15 != pbVar20; pbVar15 = pbVar15 + 1) {
      bVar3 = *pbVar15;
      (ec->super_example_predict).feature_space[bVar3].values._end =
           (ec->super_example_predict).feature_space[bVar3].values._begin + __s[bVar3];
      if ((pvVar9->audit != false) || (pvVar9->hash_inv == true)) {
        sVar29 = __s[bVar3];
        uVar24 = sVar29 << 4 | 8;
        for (; psVar12 = (ec->super_example_predict).feature_space[bVar3].space_names._begin,
            sVar29 < (ulong)((long)(ec->super_example_predict).feature_space[bVar3].space_names._end
                             - (long)psVar12 >> 4); sVar29 = sVar29 + 1) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(psVar12->
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + uVar24));
          uVar24 = uVar24 + 0x10;
        }
        (ec->super_example_predict).feature_space[bVar3].space_names._end = psVar12 + __s[bVar3];
      }
    }
    local_278 = local_278 + 1;
  }
  return;
}

Assistant:

void predict_or_learn(LRQFAstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices) lrq.orig_size[i] = ec.feature_space[i].size();

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;
  unsigned int k = lrq.k;
  float sqrtk = (float)sqrt(k);

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  uint64_t weight_mask = lrq.all->weights.mask();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa

    for (string::const_iterator i1 = lrq.field_name.begin(); i1 != lrq.field_name.end(); ++i1)
    {
      for (string::const_iterator i2 = i1 + 1; i2 != lrq.field_name.end(); ++i2)
      {
        unsigned char left = (which % 2) ? *i1 : *i2;
        unsigned char right = ((which + 1) % 2) ? *i1 : *i2;
        unsigned int lfd_id = lrq.field_id[left];
        unsigned int rfd_id = lrq.field_id[right];
        for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
        {
          features& fs = ec.feature_space[left];
          float lfx = fs.values[lfn];
          uint64_t lindex = fs.indicies[lfn];
          for (unsigned int n = 1; n <= k; ++n)
          {
            uint64_t lwindex =
                (lindex + ((uint64_t)(rfd_id * k + n) << stride_shift));  // a feature has k weights in each field
            float* lw = &all.weights[lwindex & weight_mask];
            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex) * 0.5f / sqrtk;

            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              features& rfs = ec.feature_space[right];
              //                    feature* rf = ec.atomics[right].begin + rfn;
              // NB: ec.ft_offset added by base learner
              float rfx = rfs.values[rfn];
              uint64_t rindex = rfs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)(lfd_id * k + n) << stride_shift));

              rfs.push_back(*lw * lfx * rfx, rwindex);
              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << rfs.space_names[rfn].get()->second << '^' << n;
#ifdef _WIN32
                char* new_space = _strdup("lrqfa");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrqfa");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                rfs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
    }

    for (char i : lrq.field_name)
    {
      namespace_index right = i;
      features& rfs = ec.feature_space[right];
      rfs.values.end() = rfs.values.begin() + lrq.orig_size[right];

      if (all.audit || all.hash_inv)
      {
        for (size_t j = lrq.orig_size[right]; j < rfs.space_names.size(); ++j) rfs.space_names[j].~audit_strings_ptr();

        rfs.space_names.end() = rfs.space_names.begin() + lrq.orig_size[right];
      }
    }
  }
}